

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

void gray_set_cell(gray_PWorker worker,TCoord ex,TCoord ey)

{
  int iVar1;
  PCell *ppTVar2;
  PCell_conflict pTVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = ey - worker->min_ey;
  if ((((int)uVar4 < 0) || (worker->count_ey <= (int)uVar4)) || (worker->max_ex <= ex)) {
    pTVar3 = worker->cell_null;
  }
  else {
    ppTVar2 = worker->ycells + uVar4;
    iVar5 = worker->min_ex + -1;
    if (worker->min_ex <= ex) {
      iVar5 = ex;
    }
    while( true ) {
      pTVar3 = *ppTVar2;
      iVar1 = pTVar3->x;
      if (iVar1 != iVar5 && iVar5 <= iVar1) break;
      if (iVar1 == iVar5) goto LAB_0020f2e0;
      ppTVar2 = &pTVar3->next;
    }
    pTVar3 = worker->cell_free;
    worker->cell_free = pTVar3 + 1;
    if (worker->cell_null <= pTVar3) {
      longjmp((__jmp_buf_tag *)worker,1);
    }
    pTVar3->x = iVar5;
    pTVar3->cover = 0;
    pTVar3->area = 0;
    pTVar3->next = *ppTVar2;
    *ppTVar2 = pTVar3;
  }
LAB_0020f2e0:
  worker->cell = pTVar3;
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position in the linked list. We use  */
    /* a dumpster null cell for everything outside of the clipping region  */
    /* during the render phase.  This means that:                          */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    TCoord  ey_index = ey - ras.min_ey;


    if ( ey_index < 0 || ey_index >= ras.count_ey || ex >= ras.max_ex )
      ras.cell = ras.cell_null;
    else
    {
      PCell*  pcell = ras.ycells + ey_index;
      PCell   cell;


      ex = FT_MAX( ex, ras.min_ex - 1 );

      while ( 1 )
      {
        cell = *pcell;

        if ( cell->x > ex )
          break;

        if ( cell->x == ex )
          goto Found;

        pcell = &cell->next;
      }

      /* insert new cell */
      cell = ras.cell_free++;
      if ( cell >= ras.cell_null )
        ft_longjmp( ras.jump_buffer, 1 );

      cell->x     = ex;
      cell->area  = 0;
      cell->cover = 0;

      cell->next  = *pcell;
      *pcell      = cell;

    Found:
      ras.cell = cell;
    }
  }